

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BeginDockableDragDropTarget(ImGuiWindow *window)

{
  float fVar1;
  ImGuiWindow *root_payload;
  ImGuiTabBar *pIVar2;
  bool bVar3;
  ImGuiContext *ctx;
  bool bVar4;
  bool is_explicit_target;
  int iVar5;
  ImGuiPayload *pIVar6;
  ImGuiDockNode *pIVar7;
  ImGuiDockNode *host_node;
  ImGuiDockNode *host_node_00;
  byte bVar8;
  ImGuiDockPreviewData *pIVar9;
  ImRect explicit_target_rect;
  ImGuiDockPreviewData split_inner;
  ImGuiDockPreviewData split_outer;
  ImVec2 local_298;
  ImVec2 aIStack_290 [2];
  ImGuiDockPreviewData local_280;
  ImGuiDockPreviewData local_158;
  
  ctx = GImGui;
  if ((window->Flags & 0x200000) != 0) {
    __assert_fail("(window->Flags & ImGuiWindowFlags_NoDocking) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3ee3,"void ImGui::BeginDockableDragDropTarget(ImGuiWindow *)");
  }
  if (GImGui->DragDropActive != true) {
    return;
  }
  local_280.FutureNode.ID = (ImGuiID)(window->Pos).x;
  local_280.FutureNode.SharedFlags = (ImGuiDockNodeFlags)(window->Pos).y;
  local_280.FutureNode.LocalFlags =
       (ImGuiDockNodeFlags)((window->Size).x + (float)local_280.FutureNode.ID);
  local_280.FutureNode.LocalFlagsInWindows =
       (ImGuiDockNodeFlags)((window->Size).y + (float)local_280.FutureNode.SharedFlags);
  bVar4 = BeginDragDropTargetCustom((ImRect *)&local_280,window->ID);
  if (!bVar4) {
    return;
  }
  if ((((ctx->DragDropPayload).DataFrameCount == -1) ||
      (iVar5 = strcmp("_IMWINDOW",(ctx->DragDropPayload).DataType), iVar5 != 0)) ||
     (bVar4 = DockNodeIsDropAllowed(window,*(ctx->DragDropPayload).Data), !bVar4)) {
    EndDragDropTarget();
    return;
  }
  root_payload = *(ctx->DragDropPayload).Data;
  pIVar6 = AcceptDragDropPayload("_IMWINDOW",0xc00);
  if (pIVar6 == (ImGuiPayload *)0x0) goto LAB_00136e99;
  if (window->DockNodeAsHost == (ImGuiDockNode *)0x0) {
    host_node_00 = window->DockNode;
    bVar4 = host_node_00 == (ImGuiDockNode *)0x0;
LAB_00136c6c:
    if (host_node_00 != (ImGuiDockNode *)0x0) goto LAB_00136c71;
LAB_00136c94:
    bVar3 = true;
    host_node_00 = (ImGuiDockNode *)0x0;
LAB_00136c97:
    fVar1 = (GImGui->Style).FramePadding.y;
    local_298 = window->Pos;
    aIStack_290[0].y = fVar1 + fVar1 + GImGui->FontSize + (window->Pos).y;
    aIStack_290[0].x = (window->Size).x + (window->Pos).x;
  }
  else {
    pIVar7 = DockNodeTreeFindVisibleNodeByPos(window->DockNodeAsHost,(ctx->IO).MousePos);
    if (pIVar7 == (ImGuiDockNode *)0x0) {
      bVar4 = false;
      goto LAB_00136c94;
    }
    host_node_00 = pIVar7;
    if ((((pIVar7->MergedFlags & 0x400) != 0) && (pIVar7->ParentNode == (ImGuiDockNode *)0x0)) &&
       ((pIVar7->CentralNode == (ImGuiDockNode *)0x0 ||
        (host_node_00 = pIVar7->CentralNode, pIVar7->ChildNodes[0] != (ImGuiDockNode *)0x0)))) {
      host_node_00 = DockNodeTreeFindFallbackLeafNode(pIVar7);
      bVar4 = false;
      goto LAB_00136c6c;
    }
    bVar4 = false;
LAB_00136c71:
    pIVar2 = host_node_00->TabBar;
    if ((pIVar2 == (ImGuiTabBar *)0x0) || ((host_node_00->MergedFlags & 0x3000) != 0)) {
      bVar3 = false;
      goto LAB_00136c97;
    }
    local_298 = (pIVar2->BarRect).Min;
    aIStack_290[0] = (pIVar2->BarRect).Max;
    bVar3 = false;
  }
  is_explicit_target = true;
  if ((ctx->IO).ConfigDockingWithShift == false) {
    is_explicit_target = IsMouseHoveringRect(&local_298,aIStack_290,true);
  }
  if ((ctx->DragDropPayload).Preview == false) {
    if ((ctx->DragDropPayload).Delivery != true) goto LAB_00136e99;
    bVar8 = bVar3 ^ 1;
  }
  else {
    bVar8 = ~bVar3;
  }
  if ((bool)(bVar8 & 1 | bVar4)) {
    ImGuiDockPreviewData::ImGuiDockPreviewData(&local_280);
    ImGuiDockPreviewData::ImGuiDockPreviewData(&local_158);
    if ((bVar3) ||
       ((pIVar7 = host_node_00, host_node_00->ParentNode == (ImGuiDockNode *)0x0 &&
        ((host_node_00->MergedFlags & 0x800) == 0)))) {
      bVar4 = false;
      DockNodePreviewDockSetup(window,host_node_00,root_payload,&local_280,is_explicit_target,false)
      ;
      pIVar9 = &local_280;
    }
    else {
      do {
        host_node = pIVar7;
        pIVar7 = host_node->ParentNode;
      } while (pIVar7 != (ImGuiDockNode *)0x0);
      DockNodePreviewDockSetup(window,host_node,root_payload,&local_158,is_explicit_target,true);
      pIVar9 = &local_158;
      if (local_158.IsSplitDirExplicit == false) {
        pIVar9 = &local_280;
      }
      DockNodePreviewDockSetup(window,host_node_00,root_payload,&local_280,is_explicit_target,false)
      ;
      if (local_158.IsSplitDirExplicit == true) {
        local_280.IsDropAllowed = false;
        bVar4 = true;
      }
      else {
        bVar4 = false;
      }
    }
    DockNodePreviewDockRender(window,host_node_00,root_payload,&local_280);
    DockNodePreviewDockRender(window,host_node_00,root_payload,&local_158);
    if ((pIVar9->IsDropAllowed == true) && ((ctx->DragDropPayload).Delivery == true)) {
      DockContextQueueDock
                (ctx,window,pIVar9->SplitNode,root_payload,pIVar9->SplitDir,pIVar9->SplitRatio,bVar4
                );
    }
    ImGuiDockNode::~ImGuiDockNode(&local_158.FutureNode);
    ImGuiDockNode::~ImGuiDockNode(&local_280.FutureNode);
  }
LAB_00136e99:
  EndDragDropTarget();
  return;
}

Assistant:

void ImGui::BeginDockableDragDropTarget(ImGuiWindow* window)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;

    //IM_ASSERT(window->RootWindowDockTree == window); // May also be a DockSpace
    IM_ASSERT((window->Flags & ImGuiWindowFlags_NoDocking) == 0);
    if (!g.DragDropActive)
        return;
    //GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!BeginDragDropTargetCustom(window->Rect(), window->ID))
        return;

    // Peek into the payload before calling AcceptDragDropPayload() so we can handle overlapping dock nodes with filtering
    // (this is a little unusual pattern, normally most code would call AcceptDragDropPayload directly)
    const ImGuiPayload* payload = &g.DragDropPayload;
    if (!payload->IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW) || !DockNodeIsDropAllowed(window, *(ImGuiWindow**)payload->Data))
    {
        EndDragDropTarget();
        return;
    }

    ImGuiWindow* payload_window = *(ImGuiWindow**)payload->Data;
    if (AcceptDragDropPayload(IMGUI_PAYLOAD_TYPE_WINDOW, ImGuiDragDropFlags_AcceptBeforeDelivery | ImGuiDragDropFlags_AcceptNoDrawDefaultRect))
    {
        // Select target node
        // (Important: we cannot use g.HoveredDockNode here! Because each of our target node have filters based on payload, each candidate drop target will do its own evaluation)
        bool dock_into_floating_window = false;
        ImGuiDockNode* node = NULL;
        if (window->DockNodeAsHost)
        {
            // Cannot assume that node will != NULL even though we passed the rectangle test: it depends on padding/spacing handled by DockNodeTreeFindVisibleNodeByPos().
            node = DockNodeTreeFindVisibleNodeByPos(window->DockNodeAsHost, g.IO.MousePos);

            // There is an edge case when docking into a dockspace which only has _inactive_ nodes (because none of the windows are active)
            // In this case we need to fallback into any leaf mode, possibly the central node.
            // FIXME-20181220: We should not have to test for IsLeafNode() here but we have another bug to fix first.
            if (node && node->IsDockSpace() && node->IsRootNode())
                node = (node->CentralNode && node->IsLeafNode()) ? node->CentralNode : DockNodeTreeFindFallbackLeafNode(node);
        }
        else
        {
            if (window->DockNode)
                node = window->DockNode;
            else
                dock_into_floating_window = true; // Dock into a regular window
        }

        const ImRect explicit_target_rect = (node && node->TabBar && !node->IsHiddenTabBar() && !node->IsNoTabBar()) ? node->TabBar->BarRect : ImRect(window->Pos, window->Pos + ImVec2(window->Size.x, GetFrameHeight()));
        const bool is_explicit_target = g.IO.ConfigDockingWithShift || IsMouseHoveringRect(explicit_target_rect.Min, explicit_target_rect.Max);

        // Preview docking request and find out split direction/ratio
        //const bool do_preview = true;     // Ignore testing for payload->IsPreview() which removes one frame of delay, but breaks overlapping drop targets within the same window.
        const bool do_preview = payload->IsPreview() || payload->IsDelivery();
        if (do_preview && (node != NULL || dock_into_floating_window))
        {
            ImGuiDockPreviewData split_inner;
            ImGuiDockPreviewData split_outer;
            ImGuiDockPreviewData* split_data = &split_inner;
            if (node && (node->ParentNode || node->IsCentralNode()))
                if (ImGuiDockNode* root_node = DockNodeGetRootNode(node))
                {
                    DockNodePreviewDockSetup(window, root_node, payload_window, &split_outer, is_explicit_target, true);
                    if (split_outer.IsSplitDirExplicit)
                        split_data = &split_outer;
                }
            DockNodePreviewDockSetup(window, node, payload_window, &split_inner, is_explicit_target, false);
            if (split_data == &split_outer)
                split_inner.IsDropAllowed = false;

            // Draw inner then outer, so that previewed tab (in inner data) will be behind the outer drop boxes
            DockNodePreviewDockRender(window, node, payload_window, &split_inner);
            DockNodePreviewDockRender(window, node, payload_window, &split_outer);

            // Queue docking request
            if (split_data->IsDropAllowed && payload->IsDelivery())
                DockContextQueueDock(ctx, window, split_data->SplitNode, payload_window, split_data->SplitDir, split_data->SplitRatio, split_data == &split_outer);
        }
    }
    EndDragDropTarget();
}